

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::GELU_x86_fma::forward_inplace(GELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  undefined1 (*pauVar21) [32];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 in_register_0000125c;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 extraout_var [60];
  undefined1 auVar34 [64];
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86_fma[-3]) != 0) {
    iVar17 = bottom_top_blob->c;
    if (0 < (long)iVar17) {
      uVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar20 = 0;
      do {
        auVar59._8_4_ = 0x3ba059dc;
        auVar59._0_8_ = 0x3ba059dc3ba059dc;
        auVar57._8_4_ = 0x3a270ded;
        auVar57._0_8_ = 0x3a270ded3a270ded;
        auVar55._8_4_ = 0x3779434a;
        auVar55._0_8_ = 0x3779434a3779434a;
        auVar53._8_4_ = 0x335c0041;
        auVar53._0_8_ = 0x335c0041335c0041;
        auVar51._8_4_ = 0xaebd37ff;
        auVar51._0_8_ = 0xaebd37ffaebd37ff;
        auVar49._8_4_ = 0xa59f25c0;
        auVar49._0_8_ = 0xa59f25c0a59f25c0;
        auVar47._8_4_ = 0x2a61337e;
        auVar47._0_8_ = 0x2a61337e2a61337e;
        auVar45._8_4_ = 0x41100000;
        auVar45._0_8_ = 0x4110000041100000;
        auVar43._8_4_ = 0xc1100000;
        auVar43._0_8_ = 0xc1100000c1100000;
        auVar59._12_4_ = 0x3ba059dc;
        auVar57._12_4_ = 0x3a270ded;
        auVar55._12_4_ = 0x3779434a;
        auVar53._12_4_ = 0x335c0041;
        auVar51._12_4_ = 0xaebd37ff;
        auVar49._12_4_ = 0xa59f25c0;
        auVar47._12_4_ = 0x2a61337e;
        auVar45._12_4_ = 0x41100000;
        auVar43._12_4_ = 0xc1100000;
        auVar59._16_4_ = 0x3ba059dc;
        auVar57._16_4_ = 0x3a270ded;
        auVar55._16_4_ = 0x3779434a;
        auVar53._16_4_ = 0x335c0041;
        auVar51._16_4_ = 0xaebd37ff;
        auVar49._16_4_ = 0xa59f25c0;
        auVar47._16_4_ = 0x2a61337e;
        auVar45._16_4_ = 0x41100000;
        auVar43._16_4_ = 0xc1100000;
        auVar59._20_4_ = 0x3ba059dc;
        auVar57._20_4_ = 0x3a270ded;
        auVar55._20_4_ = 0x3779434a;
        auVar53._20_4_ = 0x335c0041;
        auVar51._20_4_ = 0xaebd37ff;
        auVar49._20_4_ = 0xa59f25c0;
        auVar47._20_4_ = 0x2a61337e;
        auVar45._20_4_ = 0x41100000;
        auVar43._20_4_ = 0xc1100000;
        auVar59._24_4_ = 0x3ba059dc;
        auVar57._24_4_ = 0x3a270ded;
        auVar55._24_4_ = 0x3779434a;
        auVar53._24_4_ = 0x335c0041;
        auVar51._24_4_ = 0xaebd37ff;
        auVar49._24_4_ = 0xa59f25c0;
        auVar47._24_4_ = 0x2a61337e;
        auVar45._24_4_ = 0x41100000;
        auVar43._24_4_ = 0xc1100000;
        auVar59._28_4_ = 0x3ba059dc;
        auVar57._28_4_ = 0x3a270ded;
        auVar55._28_4_ = 0x3779434a;
        auVar53._28_4_ = 0x335c0041;
        auVar51._28_4_ = 0xaebd37ff;
        auVar49._28_4_ = 0xa59f25c0;
        auVar47._28_4_ = 0x2a61337e;
        auVar45._28_4_ = 0x41100000;
        auVar43._28_4_ = 0xc1100000;
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar20 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar19 < 8) {
          uVar16 = 0;
        }
        else {
          iVar15 = 7;
          do {
            auVar39._8_4_ = 0x38f895d6;
            auVar39._0_8_ = 0x38f895d638f895d6;
            auVar39._12_4_ = 0x38f895d6;
            auVar39._16_4_ = 0x38f895d6;
            auVar39._20_4_ = 0x38f895d6;
            auVar39._24_4_ = 0x38f895d6;
            auVar39._28_4_ = 0x38f895d6;
            auVar1 = *pauVar21;
            fVar3 = auVar1._0_4_;
            fVar4 = auVar1._4_4_;
            fVar5 = auVar1._8_4_;
            fVar6 = auVar1._12_4_;
            fVar7 = auVar1._16_4_;
            fVar9 = auVar1._20_4_;
            fVar11 = auVar1._24_4_;
            auVar2._4_4_ = fVar4 * fVar4 * 0.044715;
            auVar2._0_4_ = fVar3 * fVar3 * 0.044715;
            auVar2._8_4_ = fVar5 * fVar5 * 0.044715;
            auVar2._12_4_ = fVar6 * fVar6 * 0.044715;
            auVar2._16_4_ = fVar7 * fVar7 * 0.044715;
            auVar2._20_4_ = fVar9 * fVar9 * 0.044715;
            auVar2._24_4_ = fVar11 * fVar11 * 0.044715;
            auVar2._28_4_ = in_register_0000125c;
            auVar41 = vfmadd213ps_fma(auVar2,auVar1,auVar1);
            auVar2 = vmaxps_avx(auVar43,ZEXT1632(CONCAT412(auVar41._12_4_ * 0.7978845,
                                                           CONCAT48(auVar41._8_4_ * 0.7978845,
                                                                    CONCAT44(auVar41._4_4_ *
                                                                             0.7978845,
                                                                             auVar41._0_4_ *
                                                                             0.7978845)))));
            auVar2 = vminps_avx(auVar45,auVar2);
            fVar25 = auVar2._0_4_;
            auVar34._0_4_ = fVar25 * fVar25;
            fVar29 = auVar2._4_4_;
            auVar34._4_4_ = fVar29 * fVar29;
            fVar30 = auVar2._8_4_;
            auVar34._8_4_ = fVar30 * fVar30;
            fVar31 = auVar2._12_4_;
            auVar34._12_4_ = fVar31 * fVar31;
            fVar8 = auVar2._16_4_;
            auVar34._16_4_ = fVar8 * fVar8;
            fVar10 = auVar2._20_4_;
            auVar34._20_4_ = fVar10 * fVar10;
            fVar12 = auVar2._24_4_;
            auVar34._28_36_ = in_ZMM2._28_36_;
            auVar34._24_4_ = fVar12 * fVar12;
            auVar33 = auVar34._0_32_;
            auVar41 = vfmadd213ps_fma(auVar49,auVar33,auVar47);
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar51);
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar53);
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar55);
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar57);
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar59);
            fVar25 = auVar41._0_4_ * fVar25;
            fVar29 = auVar41._4_4_ * fVar29;
            auVar13._4_4_ = fVar29;
            auVar13._0_4_ = fVar25;
            fVar30 = auVar41._8_4_ * fVar30;
            auVar13._8_4_ = fVar30;
            fVar31 = auVar41._12_4_ * fVar31;
            auVar13._12_4_ = fVar31;
            auVar13._16_4_ = fVar8 * 0.0;
            auVar13._20_4_ = fVar10 * 0.0;
            auVar13._24_4_ = fVar12 * 0.0;
            auVar13._28_4_ = auVar2._28_4_;
            auVar36._8_4_ = 0x35a0d3d8;
            auVar36._0_8_ = 0x35a0d3d835a0d3d8;
            auVar36._12_4_ = 0x35a0d3d8;
            auVar36._16_4_ = 0x35a0d3d8;
            auVar36._20_4_ = 0x35a0d3d8;
            auVar36._24_4_ = 0x35a0d3d8;
            auVar36._28_4_ = 0x35a0d3d8;
            auVar41 = vfmadd213ps_fma(auVar36,auVar33,auVar39);
            auVar40._8_4_ = 0x3b14aa05;
            auVar40._0_8_ = 0x3b14aa053b14aa05;
            auVar40._12_4_ = 0x3b14aa05;
            auVar40._16_4_ = 0x3b14aa05;
            auVar40._20_4_ = 0x3b14aa05;
            auVar40._24_4_ = 0x3b14aa05;
            auVar40._28_4_ = 0x3b14aa05;
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar40);
            auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar33,auVar59);
            auVar2 = vrcpps_avx(ZEXT1632(auVar41));
            in_ZMM2 = ZEXT3264(auVar2);
            auVar33._4_4_ = fVar29 * auVar2._4_4_;
            auVar33._0_4_ = fVar25 * auVar2._0_4_;
            auVar33._8_4_ = fVar30 * auVar2._8_4_;
            auVar33._12_4_ = fVar31 * auVar2._12_4_;
            auVar33._16_4_ = fVar8 * 0.0 * auVar2._16_4_;
            auVar33._20_4_ = fVar10 * 0.0 * auVar2._20_4_;
            auVar33._24_4_ = fVar12 * 0.0 * auVar2._24_4_;
            auVar33._28_4_ = 0x3b14aa05;
            auVar41 = vfmsub213ps_fma(ZEXT1632(auVar41),auVar33,auVar13);
            auVar41 = vfnmadd213ps_fma(ZEXT1632(auVar41),auVar2,auVar33);
            in_register_0000125c = 0x3f000000;
            auVar14._4_4_ = fVar4 * 0.5;
            auVar14._0_4_ = fVar3 * 0.5;
            auVar14._8_4_ = fVar5 * 0.5;
            auVar14._12_4_ = fVar6 * 0.5;
            auVar14._16_4_ = fVar7 * 0.5;
            auVar14._20_4_ = fVar9 * 0.5;
            auVar14._24_4_ = fVar11 * 0.5;
            auVar14._28_4_ = auVar1._28_4_;
            auVar41 = vfmadd213ps_fma(auVar14,ZEXT1632(auVar41),auVar14);
            *pauVar21 = ZEXT1632(auVar41);
            pauVar21 = pauVar21 + 1;
            iVar15 = iVar15 + 8;
            uVar16 = uVar19 & 0xfffffff8;
          } while (iVar15 < (int)uVar19);
        }
        auVar42._8_4_ = 0xc1100000;
        auVar42._0_8_ = 0xc1100000c1100000;
        auVar42._12_4_ = 0xc1100000;
        auVar44._8_4_ = 0x41100000;
        auVar44._0_8_ = 0x4110000041100000;
        auVar44._12_4_ = 0x41100000;
        auVar46._8_4_ = 0x2a61337e;
        auVar46._0_8_ = 0x2a61337e2a61337e;
        auVar46._12_4_ = 0x2a61337e;
        auVar48._8_4_ = 0xa59f25c0;
        auVar48._0_8_ = 0xa59f25c0a59f25c0;
        auVar48._12_4_ = 0xa59f25c0;
        auVar50._8_4_ = 0xaebd37ff;
        auVar50._0_8_ = 0xaebd37ffaebd37ff;
        auVar50._12_4_ = 0xaebd37ff;
        auVar52._8_4_ = 0x335c0041;
        auVar52._0_8_ = 0x335c0041335c0041;
        auVar52._12_4_ = 0x335c0041;
        auVar54._8_4_ = 0x3779434a;
        auVar54._0_8_ = 0x3779434a3779434a;
        auVar54._12_4_ = 0x3779434a;
        auVar56._8_4_ = 0x3a270ded;
        auVar56._0_8_ = 0x3a270ded3a270ded;
        auVar56._12_4_ = 0x3a270ded;
        auVar58._8_4_ = 0x3ba059dc;
        auVar58._0_8_ = 0x3ba059dc3ba059dc;
        auVar58._12_4_ = 0x3ba059dc;
        auVar41._8_4_ = 0x3b14aa05;
        auVar41._0_8_ = 0x3b14aa053b14aa05;
        auVar41._12_4_ = 0x3b14aa05;
        uVar18 = uVar16 | 3;
        while ((int)uVar18 < (int)uVar19) {
          auVar35 = *(undefined1 (*) [16])*pauVar21;
          fVar3 = auVar35._0_4_;
          fVar4 = auVar35._4_4_;
          fVar5 = auVar35._8_4_;
          fVar6 = auVar35._12_4_;
          auVar26._0_4_ = fVar3 * fVar3 * 0.044715;
          auVar26._4_4_ = fVar4 * fVar4 * 0.044715;
          auVar26._8_4_ = fVar5 * fVar5 * 0.044715;
          auVar26._12_4_ = fVar6 * fVar6 * 0.044715;
          auVar35 = vfmadd213ps_fma(auVar26,auVar35,auVar35);
          auVar27._0_4_ = auVar35._0_4_ * 0.7978845;
          auVar27._4_4_ = auVar35._4_4_ * 0.7978845;
          auVar27._8_4_ = auVar35._8_4_ * 0.7978845;
          auVar27._12_4_ = auVar35._12_4_ * 0.7978845;
          auVar35 = vmaxps_avx(auVar42,auVar27);
          auVar35 = vminps_avx(auVar44,auVar35);
          fVar25 = auVar35._0_4_;
          auVar32._0_4_ = fVar25 * fVar25;
          fVar29 = auVar35._4_4_;
          auVar32._4_4_ = fVar29 * fVar29;
          fVar30 = auVar35._8_4_;
          auVar32._8_4_ = fVar30 * fVar30;
          fVar31 = auVar35._12_4_;
          auVar32._12_4_ = fVar31 * fVar31;
          auVar35 = vfmadd213ps_fma(auVar48,auVar32,auVar46);
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar50);
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar52);
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar54);
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar56);
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar58);
          auVar28._0_4_ = auVar35._0_4_ * fVar25;
          auVar28._4_4_ = auVar35._4_4_ * fVar29;
          auVar28._8_4_ = auVar35._8_4_ * fVar30;
          auVar28._12_4_ = auVar35._12_4_ * fVar31;
          auVar35._8_4_ = 0x35a0d3d8;
          auVar35._0_8_ = 0x35a0d3d835a0d3d8;
          auVar35._12_4_ = 0x35a0d3d8;
          auVar37._8_4_ = 0x38f895d6;
          auVar37._0_8_ = 0x38f895d638f895d6;
          auVar37._12_4_ = 0x38f895d6;
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar37);
          auVar35 = vfmadd213ps_fma(auVar35,auVar32,auVar41);
          auVar23 = vfmadd213ps_fma(auVar35,auVar32,auVar58);
          auVar35 = vrcpps_avx(auVar23);
          auVar38._0_4_ = auVar28._0_4_ * auVar35._0_4_;
          auVar38._4_4_ = auVar28._4_4_ * auVar35._4_4_;
          auVar38._8_4_ = auVar28._8_4_ * auVar35._8_4_;
          auVar38._12_4_ = auVar28._12_4_ * auVar35._12_4_;
          auVar23 = vfmsub213ps_fma(auVar23,auVar38,auVar28);
          auVar35 = vfnmadd213ps_fma(auVar23,auVar35,auVar38);
          auVar23._0_4_ = fVar3 * 0.5;
          auVar23._4_4_ = fVar4 * 0.5;
          auVar23._8_4_ = fVar5 * 0.5;
          auVar23._12_4_ = fVar6 * 0.5;
          auVar35 = vfmadd213ps_fma(auVar23,auVar35,auVar23);
          *(undefined1 (*) [16])*pauVar21 = auVar35;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar18 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar19 - uVar16 != 0 && (int)uVar16 <= (int)uVar19) {
          lVar22 = 0;
          do {
            fVar3 = *(float *)(*pauVar21 + lVar22 * 4);
            auVar41 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 * 0.044715)),ZEXT416((uint)fVar3)
                                      ,ZEXT416((uint)fVar3));
            auVar24._0_4_ = tanhf(auVar41._0_4_ * 0.7978845);
            auVar24._4_60_ = extraout_var;
            auVar41 = vfmadd213ss_fma(auVar24._0_16_,ZEXT416((uint)(fVar3 * 0.5)),
                                      ZEXT416((uint)(fVar3 * 0.5)));
            *(int *)(*pauVar21 + lVar22 * 4) = auVar41._0_4_;
            lVar22 = lVar22 + 1;
          } while (uVar19 - uVar16 != (int)lVar22);
        }
        in_ZMM2 = ZEXT464(0x3d372713);
        in_register_0000125c = 0;
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar17);
    }
    return 0;
  }
  iVar17 = GELU::forward_inplace
                     ((GELU *)((long)&this->_vptr_GELU_x86_fma + (long)this->_vptr_GELU_x86_fma[-3])
                      ,bottom_top_blob,opt);
  return iVar17;
}

Assistant:

int GELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}